

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAtomicCounterTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::specToTestDescription_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TestSpec *spec)

{
  uint uVar1;
  ostream *poVar2;
  ostringstream stream;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,"Test ");
  uVar1 = *(uint *)(this + 4);
  if ((uVar1 & 4) != 0) {
    std::operator<<((ostream *)local_190,"atomicCounter()");
    uVar1 = *(uint *)(this + 4);
  }
  if ((uVar1 & 1) != 0) {
    std::operator<<((ostream *)local_190,", ");
    std::operator<<((ostream *)local_190," atomicCounterIncrement()");
    uVar1 = *(uint *)(this + 4);
  }
  if ((uVar1 & 2) != 0) {
    std::operator<<((ostream *)local_190,", ");
    std::operator<<((ostream *)local_190," atomicCounterDecrement()");
  }
  std::operator<<((ostream *)local_190," calls with ");
  if (this[0xc] == (_anonymous_namespace_)0x1) {
    std::operator<<((ostream *)local_190," branches, ");
  }
  poVar2 = (ostream *)std::ostream::operator<<(local_190,*(int *)this);
  poVar2 = std::operator<<(poVar2," atomic counters, ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(this + 8));
  poVar2 = std::operator<<(poVar2," calls and ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(this + 0x10));
  std::operator<<(poVar2," threads.");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

string specToTestDescription (const AtomicCounterTest::TestSpec& spec)
{
	std::ostringstream	stream;
	bool				firstOperation = 0;

	stream
	<< "Test ";

	if ((spec.operations & AtomicCounterTest::OPERATION_GET) != 0)
	{
		stream << "atomicCounter()";
		firstOperation = false;
	}

	if ((spec.operations & AtomicCounterTest::OPERATION_INC) != 0)
	{
		if (!firstOperation)
			stream << ", ";

		stream << " atomicCounterIncrement()";
		firstOperation = false;
	}

	if ((spec.operations & AtomicCounterTest::OPERATION_DEC) != 0)
	{
		if (!firstOperation)
			stream << ", ";

		stream << " atomicCounterDecrement()";
		firstOperation = false;
	}

	stream << " calls with ";

	if (spec.useBranches)
		stream << " branches, ";

	stream << spec.atomicCounterCount << " atomic counters, " << spec.callCount << " calls and " << spec.threadCount << " threads.";

	return stream.str();
}